

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

EnumValueSymbol * __thiscall
slang::ast::EnumValueSymbol::fromSyntax
          (EnumValueSymbol *this,Compilation *compilation,DeclaratorSyntax *syntax,Type *type,
          optional<int> index)

{
  bool bVar1;
  int *piVar2;
  _Storage<int,_true> index_00;
  string_view name_00;
  SourceLocation local_68;
  EnumValueSymbol *local_60;
  EnumValueSymbol *ev;
  size_t local_50;
  string_view local_48;
  undefined1 local_38 [8];
  string_view name;
  Type *type_local;
  DeclaratorSyntax *syntax_local;
  Compilation *compilation_local;
  optional<int> index_local;
  
  index_00._M_value =
       index.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
       _M_payload;
  name._M_str = (char *)syntax;
  compilation_local = (Compilation *)type;
  _local_38 = parsing::Token::valueText((Token *)&compilation->options);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&compilation_local);
  if (bVar1) {
    ev = (EnumValueSymbol *)local_38;
    local_50 = name._M_len;
    piVar2 = std::optional<int>::operator*((optional<int> *)&compilation_local);
    name_00._M_str._0_4_ = *piVar2;
    name_00._M_len = local_50;
    name_00._M_str._4_4_ = 0;
    local_48 = getEnumValueName((ast *)this,(Compilation *)ev,name_00,index_00._M_value);
    _local_38 = local_48;
  }
  local_68 = parsing::Token::location((Token *)&compilation->options);
  local_60 = BumpAllocator::
             emplace<slang::ast::EnumValueSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation>
                       ((BumpAllocator *)this,
                        (basic_string_view<char,_std::char_traits<char>_> *)local_38,&local_68);
  ValueSymbol::setType(&local_60->super_ValueSymbol,(Type *)name._M_str);
  Symbol::setSyntax((Symbol *)local_60,(SyntaxNode *)compilation);
  return local_60;
}

Assistant:

EnumValueSymbol& EnumValueSymbol::fromSyntax(Compilation& compilation,
                                             const DeclaratorSyntax& syntax, const Type& type,
                                             std::optional<int32_t> index) {
    string_view name = syntax.name.valueText();
    if (index)
        name = getEnumValueName(compilation, name, *index);

    auto ev = compilation.emplace<EnumValueSymbol>(name, syntax.name.location());
    ev->setType(type);
    ev->setSyntax(syntax);
    return *ev;
}